

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

StringRef llvm::yaml::ScalarTraits<int,_void>::input(StringRef Scalar,void *param_2,int32_t *Val)

{
  bool bVar1;
  long in_RAX;
  char *pcVar2;
  size_t sVar3;
  longlong *in_R8;
  StringRef Str;
  StringRef SVar4;
  long local_18;
  longlong N;
  
  Str.Data = Scalar.Length;
  Str.Length = 0;
  local_18 = in_RAX;
  bVar1 = getAsSignedInteger((llvm *)Scalar.Data,Str,(uint)&local_18,in_R8);
  if (bVar1) {
    sVar3 = 0xe;
    pcVar2 = "invalid number";
  }
  else if ((int)local_18 == local_18) {
    *Val = (int)local_18;
    pcVar2 = (char *)0x0;
    sVar3 = 0;
  }
  else {
    sVar3 = 0x13;
    pcVar2 = "out of range number";
  }
  SVar4.Length = sVar3;
  SVar4.Data = pcVar2;
  return SVar4;
}

Assistant:

StringRef ScalarTraits<int32_t>::input(StringRef Scalar, void *, int32_t &Val) {
  long long N;
  if (getAsSignedInteger(Scalar, 0, N))
    return "invalid number";
  if ((N > INT32_MAX) || (N < INT32_MIN))
    return "out of range number";
  Val = N;
  return StringRef();
}